

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_rem_m68k(float128 a,float128 b,float_status *status)

{
  float128 fVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  char cVar6;
  ulong uVar7;
  uint64_t zSig1;
  long lVar8;
  long lVar9;
  uint64_t zSig0;
  ulong uVar10;
  ulong uVar11;
  uint32_t aLow;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t bLow;
  uint64_t uVar15;
  ulong uVar16;
  uint32_t aLow_1;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  int32_t bExp;
  int32_t aExp;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  uint local_98;
  uint local_94;
  ulong local_90;
  float_status *local_88;
  ulong local_80;
  uint64_t local_78;
  ulong local_70;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_78 = b.low;
  uVar15 = a.low;
  uVar16 = a.high & 0xffffffffffff;
  uVar17 = a.high._6_2_ & 0x7fff;
  local_70 = b.high & 0xffffffffffff;
  local_ac = b.high._6_2_ & 0x7fff;
  local_94 = uVar17;
  local_68 = uVar15;
  local_60 = uVar16;
  if (uVar17 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
         uVar15 == 0) &&
       (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_78 == 0 || local_ac != 0x7fff)) {
LAB_006cc5df:
      status->float_exception_flags = status->float_exception_flags | 1;
      fVar1.high = 0x7fffffffffffffff;
      fVar1.low = 0xffffffffffffffff;
      return fVar1;
    }
LAB_006cc29b:
    a = propagateFloat128NaN(a,b,status);
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_78 == 0) goto LAB_006cc5df;
      normalizeFloat128Subnormal(local_70,local_78,(int32_t *)&local_ac,&local_70,&local_78);
    }
    else if (local_ac == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_78 == 0) {
        return a;
      }
      goto LAB_006cc29b;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar15 == 0) {
        return a;
      }
      normalizeFloat128Subnormal(uVar16,uVar15,(int32_t *)&local_94,&local_60,&local_68);
      uVar17 = local_94;
    }
    iVar18 = uVar17 - local_ac;
    if (-2 < iVar18) {
      bVar5 = iVar18 == -1 ^ 0xf;
      uVar10 = local_68 << bVar5;
      uVar13 = local_68 >> ((iVar18 == -1) + 0x31U & 0x3f) | (local_60 | 0x1000000000000) << bVar5;
      uVar12 = local_78 * 0x8000;
      uVar3 = local_70 << 0xf;
      local_a8 = uVar3 | 0x8000000000000000;
      local_90 = local_78 >> 0x31;
      uVar16 = local_90 + local_a8;
      bVar20 = uVar16 <= uVar13;
      bVar23 = uVar13 == uVar16;
      bVar21 = uVar12 <= uVar10;
      if (bVar21 && bVar23 || bVar20 && !bVar23) {
        bVar22 = uVar10 < uVar12;
        uVar10 = uVar10 + local_78 * -0x8000;
        uVar13 = (uVar13 - uVar16) - (ulong)bVar22;
      }
      local_98 = local_ac;
      uVar17 = iVar18 - 0x40;
      if (iVar18 < 0x41) {
        uVar7 = (ulong)(bVar21 && bVar23 || bVar20 && !bVar23);
      }
      else {
        uVar14 = local_a8 >> 0x20;
        local_50 = uVar3 & 0xffffffff00000000 | 0x8000000000000000;
        local_80 = uVar16 & 0xffffffff;
        local_40 = uVar12 >> 0x20;
        local_48 = uVar12 & 0xffffffff;
        uVar2 = uVar17;
        do {
          local_38 = uVar10;
          local_a0 = (ulong)uVar2;
          uVar10 = 0xffffffffffffffff;
          if (uVar13 < uVar16) {
            uVar7 = 0xffffffff00000000;
            if (uVar13 < local_50) {
              uVar7 = uVar13 / uVar14 << 0x20;
            }
            uVar4 = (uVar7 >> 0x20) * local_80;
            uVar19 = uVar7 * uVar16;
            uVar10 = local_38 - uVar19;
            lVar8 = ((uVar13 - ((uVar4 >> 0x20) + uVar14 * (uVar7 >> 0x20))) -
                    (ulong)(local_38 < uVar19)) - (ulong)(uVar19 < uVar4 << 0x20);
            if (lVar8 < 0) {
              uVar4 = (0x100000000 - uVar7) * uVar16 + local_38;
              uVar19 = uVar10;
              do {
                uVar7 = uVar7 - 0x100000000;
                uVar10 = uVar19 + (uVar16 << 0x20);
                bVar20 = uVar4 < uVar19;
                uVar4 = uVar4 + (uVar16 << 0x20);
                lVar8 = lVar8 + uVar14 + (ulong)bVar20;
                uVar19 = uVar10;
              } while (lVar8 < 0);
            }
            uVar10 = uVar10 >> 0x20 | lVar8 << 0x20;
            if (uVar10 < local_50) {
              uVar10 = uVar10 / uVar14;
            }
            else {
              uVar10 = 0xffffffff;
            }
            uVar10 = uVar10 | uVar7;
          }
          uVar7 = uVar10 - 4;
          if (uVar10 < 4) {
            uVar7 = 0;
          }
          uVar10 = uVar7 >> 0x20;
          uVar4 = (uVar7 & 0xffffffff) * local_40;
          uVar19 = uVar4 + uVar10 * local_48;
          lVar8 = 0;
          if (CARRY8(uVar4,uVar10 * local_48)) {
            lVar8 = 0x100000000;
          }
          lVar9 = (uVar7 & 0xffffffff) * uVar14 + uVar10 * local_80;
          uVar4 = uVar7 * uVar16;
          uVar19 = uVar10 * local_40 + uVar4 + (uVar19 >> 0x20) + lVar8 +
                   (ulong)(uVar7 * uVar12 < uVar19 << 0x20);
          uVar11 = uVar19 << 0x3d | uVar7 * uVar12 >> 3;
          uVar10 = -uVar11;
          uVar13 = ((uVar13 << 0x3d | local_38 >> 3) - (ulong)(uVar11 != 0)) -
                   ((ulong)((uint)(uVar19 < uVar4) +
                           (uint)(uVar4 < (ulong)(lVar9 << 0x20)) +
                           (int)((ulong)lVar9 >> 0x20) +
                           (int)(local_a8 >> 0x20) * (int)(uVar7 >> 0x20)) << 0x3d | uVar19 >> 3);
          uVar17 = uVar2 - 0x3d;
          bVar20 = 0x3d < (int)uVar2;
          uVar2 = uVar17;
        } while (bVar20);
      }
      if ((int)uVar17 < -0x3f) {
        uVar15 = uVar13 >> 0xc;
        uVar10 = uVar10 >> 0xc | uVar13 << 0x34;
        uVar3 = local_90 << 0x34 | uVar12 >> 0xc;
      }
      else {
        uVar14 = 0xffffffffffffffff;
        if (uVar13 < uVar16) {
          uVar4 = local_a8 >> 0x20;
          uVar7 = 0xffffffff00000000;
          local_a8 = uVar3 & 0xffffffff00000000 | 0x8000000000000000;
          if (uVar13 < local_a8) {
            uVar7 = uVar13 / uVar4 << 0x20;
          }
          uVar19 = (uVar16 & 0xffffffff) * (uVar7 >> 0x20);
          uVar14 = uVar7 * uVar16;
          uVar3 = uVar10 - uVar14;
          lVar8 = ((uVar13 - ((uVar19 >> 0x20) + (uVar7 >> 0x20) * uVar4)) -
                  (ulong)(uVar10 < uVar14)) - (ulong)(uVar14 < uVar19 << 0x20);
          if (lVar8 < 0) {
            uVar14 = (0x100000000 - uVar7) * uVar16 + uVar10;
            uVar19 = uVar3;
            do {
              uVar7 = uVar7 - 0x100000000;
              uVar3 = uVar19 + (uVar16 << 0x20);
              bVar20 = uVar14 < uVar19;
              uVar14 = uVar14 + (uVar16 << 0x20);
              lVar8 = lVar8 + uVar4 + (ulong)bVar20;
              uVar19 = uVar3;
            } while (lVar8 < 0);
          }
          uVar14 = uVar3 >> 0x20 | lVar8 << 0x20;
          if (uVar14 < local_a8) {
            uVar14 = uVar14 / uVar4;
          }
          else {
            uVar14 = 0xffffffff;
          }
          uVar14 = uVar14 | uVar7;
          local_a0 = uVar12;
        }
        uVar7 = 0;
        if (3 < uVar14) {
          uVar7 = uVar14 - 4;
        }
        cVar6 = (char)uVar17;
        uVar7 = uVar7 >> (-cVar6 & 0x3fU);
        uVar3 = local_90 << 0x34 | uVar12 >> 0xc;
        bVar5 = (byte)(uVar17 + 0x34);
        if ((int)uVar17 < -0x34) {
          uVar14 = uVar10 >> (-cVar6 - 0x34U & 0x3f) | uVar13 << (bVar5 & 0x3f);
          uVar13 = uVar13 >> (-cVar6 - 0x34U & 0x3f);
        }
        else {
          uVar14 = uVar10 << (bVar5 & 0x3f);
          if (uVar17 + 0x34 != 0) {
            uVar13 = uVar13 << (bVar5 & 0x3f) | uVar10 >> (0xcU - cVar6 & 0x3f);
          }
        }
        uVar10 = (uVar12 >> 0xc & 0xffffffff) * (uVar7 >> 0x20);
        uVar12 = (uVar7 & 0xffffffff) * (uVar3 >> 0x20);
        lVar8 = 0;
        uVar4 = uVar12 + uVar10;
        if (CARRY8(uVar12,uVar10)) {
          lVar8 = -0x100000000;
        }
        uVar12 = uVar7 * uVar3;
        uVar10 = uVar14 - uVar12;
        uVar15 = (((lVar8 - ((uVar7 >> 0x20) * (uVar3 >> 0x20) + uVar7 * (uVar16 >> 0xc) +
                            (uVar4 >> 0x20))) - (ulong)(uVar12 < uVar4 << 0x20)) + uVar13) -
                 (ulong)(uVar14 < uVar12);
      }
      zSig1 = uVar10 + uVar3;
      uVar13 = uVar10 * 2 + uVar3;
      uVar7 = uVar7 - 1;
      do {
        zSig0 = uVar15;
        uVar13 = uVar13 + uVar3 * -2;
        zSig1 = zSig1 - uVar3;
        uVar7 = uVar7 + 1;
        bVar20 = uVar10 < uVar3;
        uVar10 = uVar10 - uVar3;
        uVar15 = (zSig0 - (uVar16 >> 0xc)) - (ulong)bVar20;
      } while (-1 < (long)uVar15);
      lVar8 = uVar15 + zSig0 + (ulong)(uVar13 < uVar10);
      if (((-1 < lVar8) && ((uVar7 & 1) != 0 || (lVar8 != 0 || uVar13 != 0))) ||
         (uVar15 = zSig0, uVar10 = zSig1, (long)zSig0 < 0)) {
        zSig1 = -uVar10;
        zSig0 = -uVar15 - (ulong)(uVar10 != 0);
      }
      local_88 = status;
      local_58 = a.high;
      a = normalizeRoundAndPackFloat128
                    ((byte)((byte)(uVar15 >> 0x38) ^ a.high._7_1_) >> 7,local_ac - 4,zSig0,zSig1,
                     status);
    }
  }
  return a;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}